

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O2

apx_error_t
write_dynamic_value_to_buffer(uint8_t *begin,uint8_t *end,uint32_t value,uint32_t value_size)

{
  if (value_size != 4) {
    if (value_size == 2) {
      if (0xffff < value) {
        return 7;
      }
    }
    else {
      if (value_size != 1) {
        return 6;
      }
      if (0xff < value) {
        return 7;
      }
    }
  }
  if (begin + value_size <= end) {
    packLE(begin,value,(uint8_t)value_size);
    return 0;
  }
  return 0x26;
}

Assistant:

static apx_error_t write_dynamic_value_to_buffer(uint8_t* begin, uint8_t* end, uint32_t value, uint32_t value_size)
{
   switch (value_size)
   {
   case UINT8_SIZE:
      if (value > (uint32_t) UINT8_MAX)
      {
         return APX_LENGTH_ERROR;
      }
      break;
   case UINT16_SIZE:
      if (value > (uint32_t)UINT16_MAX)
      {
         return APX_LENGTH_ERROR;
      }
      break;
   case UINT32_SIZE:
      //No check needed
      break;
   default:
      return APX_INTERNAL_ERROR;
   }
   if (begin + value_size <= end)
   {
      packLE(begin, value, (uint8_t)value_size);
   }
   else
   {
      return APX_BUFFER_FULL_ERROR;
   }
   return APX_NO_ERROR;
}